

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

task_t * __thiscall
jessilib::thread_pool::pop_task(task_t *__return_storage_ptr__,thread_pool *this)

{
  function<void_()> *__x;
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_tasks_mutex);
  if (iVar1 == 0) {
    __x = (this->m_tasks).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_tasks).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == __x) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    }
    else {
      std::function<void_()>::function(__return_storage_ptr__,__x);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&(this->m_tasks).c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_tasks_mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

thread_pool::task_t thread_pool::pop_task() {
	std::lock_guard<std::mutex> guard(m_tasks_mutex);
	if (!m_tasks.empty()) {
		task_t task = m_tasks.front();
		m_tasks.pop();
		return task;
	}

	return nullptr;
}